

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O2

void __thiscall cmExtraEclipseCDT4Generator::CreateProjectFile(cmExtraEclipseCDT4Generator *this)

{
  string *psVar1;
  cmExtraEclipseCDT4Generator *pcVar2;
  bool bVar3;
  char *pcVar4;
  _Base_ptr p_Var5;
  cmState *this_00;
  pointer value;
  string sourceLinkedResourceName;
  allocator local_67b;
  allocator local_67a;
  allocator local_679;
  cmLocalGenerator *local_678;
  cmMakefile *local_670;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraNatures;
  cmXMLWriter xml;
  string local_5f8;
  string *local_5d8;
  cmExtraEclipseCDT4Generator *local_5d0;
  string compilerId;
  ostringstream environment;
  string local_430;
  string filename;
  ostringstream errorOutputParser;
  cmGeneratedFileStream fout;
  
  local_678 = *(((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->LocalGenerators)
               .super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
               super__Vector_impl_data._M_start;
  local_670 = local_678->Makefile;
  local_5d8 = &this->HomeOutputDirectory;
  local_5d0 = this;
  std::operator+(&filename,local_5d8,"/.project");
  cmGeneratedFileStream::cmGeneratedFileStream(&fout,filename._M_dataplus._M_p,false,None);
  if (((&fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
       [(long)fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
              _vptr_basic_ostream[-3]] & 5) != 0) goto LAB_0039a85e;
  std::__cxx11::string::string
            ((string *)&environment,"CMAKE_C_COMPILER_ID",(allocator *)&errorOutputParser);
  pcVar4 = cmMakefile::GetSafeDefinition(local_670,(string *)&environment);
  pcVar2 = local_5d0;
  psVar1 = local_5d8;
  std::__cxx11::string::string((string *)&compilerId,pcVar4,(allocator *)&xml);
  std::__cxx11::string::~string((string *)&environment);
  if (compilerId._M_string_length == 0) {
    std::__cxx11::string::string
              ((string *)&environment,"CMAKE_CXX_COMPILER_ID",(allocator *)&errorOutputParser);
    cmMakefile::GetSafeDefinition(local_670,(string *)&environment);
    std::__cxx11::string::assign((char *)&compilerId);
    std::__cxx11::string::~string((string *)&environment);
  }
  cmXMLWriter::cmXMLWriter(&xml,(ostream *)&fout,0);
  cmXMLWriter::StartDocument(&xml,"UTF-8");
  std::__cxx11::string::string
            ((string *)&environment,"projectDescription",(allocator *)&errorOutputParser);
  cmXMLWriter::StartElement(&xml,(string *)&environment);
  std::__cxx11::string::~string((string *)&environment);
  std::__cxx11::string::string((string *)&environment,"name",&local_679);
  cmLocalGenerator::GetProjectName_abi_cxx11_(&sourceLinkedResourceName,local_678);
  std::__cxx11::string::string((string *)&local_5f8,"CMAKE_BUILD_TYPE",&local_67a);
  pcVar4 = cmMakefile::GetSafeDefinition(local_670,&local_5f8);
  std::__cxx11::string::string((string *)&extraNatures,pcVar4,&local_67b);
  GetPathBasename(&local_430,psVar1);
  GenerateProjectName((string *)&errorOutputParser,&sourceLinkedResourceName,(string *)&extraNatures
                      ,&local_430);
  cmXMLWriter::Element<std::__cxx11::string>
            (&xml,(string *)&environment,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&errorOutputParser
            );
  std::__cxx11::string::~string((string *)&errorOutputParser);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&extraNatures);
  std::__cxx11::string::~string((string *)&local_5f8);
  std::__cxx11::string::~string((string *)&sourceLinkedResourceName);
  std::__cxx11::string::~string((string *)&environment);
  std::__cxx11::string::string((string *)&environment,"comment",(allocator *)&errorOutputParser);
  cmXMLWriter::Element<char[1]>(&xml,(string *)&environment,(char (*) [1])0x54055a);
  std::__cxx11::string::~string((string *)&environment);
  std::__cxx11::string::string((string *)&environment,"projects",(allocator *)&errorOutputParser);
  cmXMLWriter::Element<char[1]>(&xml,(string *)&environment,(char (*) [1])0x54055a);
  std::__cxx11::string::~string((string *)&environment);
  std::__cxx11::string::string((string *)&environment,"buildSpec",(allocator *)&errorOutputParser);
  cmXMLWriter::StartElement(&xml,(string *)&environment);
  std::__cxx11::string::~string((string *)&environment);
  std::__cxx11::string::string
            ((string *)&environment,"buildCommand",(allocator *)&errorOutputParser);
  cmXMLWriter::StartElement(&xml,(string *)&environment);
  std::__cxx11::string::~string((string *)&environment);
  std::__cxx11::string::string((string *)&environment,"name",(allocator *)&errorOutputParser);
  cmXMLWriter::Element<char[38]>
            (&xml,(string *)&environment,(char (*) [38])"org.eclipse.cdt.make.core.makeBuilder");
  std::__cxx11::string::~string((string *)&environment);
  std::__cxx11::string::string((string *)&environment,"triggers",(allocator *)&errorOutputParser);
  cmXMLWriter::Element<char[24]>
            (&xml,(string *)&environment,(char (*) [24])"clean,full,incremental,");
  std::__cxx11::string::~string((string *)&environment);
  std::__cxx11::string::string((string *)&environment,"arguments",(allocator *)&errorOutputParser);
  cmXMLWriter::StartElement(&xml,(string *)&environment);
  std::__cxx11::string::~string((string *)&environment);
  AppendDictionary<char[6]>
            (&xml,"org.eclipse.cdt.make.core.cleanBuildTarget",(char (*) [6])0x52d601);
  AppendDictionary<char[5]>
            (&xml,"org.eclipse.cdt.make.core.enableCleanBuild",(char (*) [5])0x5227b7);
  AppendDictionary<char[5]>
            (&xml,"org.eclipse.cdt.make.core.append_environment",(char (*) [5])0x5227b7);
  AppendDictionary<char[5]>(&xml,"org.eclipse.cdt.make.core.stopOnError",(char (*) [5])0x5227b7);
  AppendDictionary<char[5]>
            (&xml,"org.eclipse.cdt.make.core.enabledIncrementalBuild",(char (*) [5])0x5227b7);
  std::__cxx11::string::string
            ((string *)&sourceLinkedResourceName,"CMAKE_MAKE_PROGRAM",(allocator *)&extraNatures);
  pcVar4 = cmMakefile::GetRequiredDefinition(local_670,&sourceLinkedResourceName);
  std::__cxx11::string::string((string *)&errorOutputParser,pcVar4,(allocator *)&local_5f8);
  std::__cxx11::string::string((string *)&environment,(string *)&errorOutputParser);
  AppendDictionary<std::__cxx11::string>
            (&xml,"org.eclipse.cdt.make.core.build.command",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&environment);
  std::__cxx11::string::~string((string *)&environment);
  std::__cxx11::string::~string((string *)&errorOutputParser);
  std::__cxx11::string::~string((string *)&sourceLinkedResourceName);
  AppendDictionary<char[47]>
            (&xml,"org.eclipse.cdt.make.core.contents",
             (char (*) [47])"org.eclipse.cdt.make.core.activeConfigSettings");
  AppendDictionary<char[4]>
            (&xml,"org.eclipse.cdt.make.core.build.target.inc",(char (*) [4])0x52152d);
  std::__cxx11::string::string
            ((string *)&environment,"CMAKE_ECLIPSE_MAKE_ARGUMENTS",
             (allocator *)&sourceLinkedResourceName);
  _errorOutputParser = cmMakefile::GetSafeDefinition(local_670,(string *)&environment);
  AppendDictionary<char_const*>
            (&xml,"org.eclipse.cdt.make.core.build.arguments",(char **)&errorOutputParser);
  std::__cxx11::string::~string((string *)&environment);
  std::__cxx11::string::string((string *)&environment,(string *)psVar1);
  AppendDictionary<std::__cxx11::string>
            (&xml,"org.eclipse.cdt.make.core.buildLocation",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&environment);
  std::__cxx11::string::~string((string *)&environment);
  AppendDictionary<char[6]>
            (&xml,"org.eclipse.cdt.make.core.useDefaultBuildCmd",(char (*) [6])0x535cc1);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&environment);
  std::operator<<((ostream *)&environment,"VERBOSE=1|CMAKE_NO_VERBOSE=1|");
  bVar3 = std::operator==(&compilerId,"MSVC");
  if (bVar3) {
    AddEnvVar((ostream *)&environment,"PATH",local_678);
    AddEnvVar((ostream *)&environment,"INCLUDE",local_678);
    AddEnvVar((ostream *)&environment,"LIB",local_678);
    pcVar4 = "LIBPATH";
LAB_0039a259:
    AddEnvVar((ostream *)&environment,pcVar4,local_678);
  }
  else {
    bVar3 = std::operator==(&compilerId,"Intel");
    if (bVar3) {
      pcVar4 = "INTEL_LICENSE_FILE";
      goto LAB_0039a259;
    }
  }
  std::__cxx11::stringbuf::str();
  AppendDictionary<std::__cxx11::string>
            (&xml,"org.eclipse.cdt.make.core.environment",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&errorOutputParser
            );
  std::__cxx11::string::~string((string *)&errorOutputParser);
  AppendDictionary<char[5]>(&xml,"org.eclipse.cdt.make.core.enableFullBuild",(char (*) [5])0x5227b7)
  ;
  AppendDictionary<char[4]>
            (&xml,"org.eclipse.cdt.make.core.build.target.auto",(char (*) [4])0x52152d);
  AppendDictionary<char[6]>(&xml,"org.eclipse.cdt.make.core.enableAutoBuild",(char (*) [6])0x535cc1)
  ;
  AppendDictionary<char[6]>
            (&xml,"org.eclipse.cdt.make.core.build.target.clean",(char (*) [6])0x52d601);
  AppendDictionary<char[4]>(&xml,"org.eclipse.cdt.make.core.fullBuildTarget",(char (*) [4])0x52152d)
  ;
  AppendDictionary<char[1]>(&xml,"org.eclipse.cdt.make.core.buildArguments",(char (*) [1])0x54055a);
  std::__cxx11::string::string((string *)&errorOutputParser,(string *)psVar1);
  AppendDictionary<std::__cxx11::string>
            (&xml,"org.eclipse.cdt.make.core.build.location",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&errorOutputParser
            );
  std::__cxx11::string::~string((string *)&errorOutputParser);
  AppendDictionary<char[4]>(&xml,"org.eclipse.cdt.make.core.autoBuildTarget",(char (*) [4])0x52152d)
  ;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&errorOutputParser);
  bVar3 = std::operator==(&compilerId,"MSVC");
  if (bVar3) {
    pcVar4 = "org.eclipse.cdt.core.VCErrorParser;";
LAB_0039a3d1:
    std::operator<<((ostream *)&errorOutputParser,pcVar4);
  }
  else {
    bVar3 = std::operator==(&compilerId,"Intel");
    if (bVar3) {
      pcVar4 = "org.eclipse.cdt.core.ICCErrorParser;";
      goto LAB_0039a3d1;
    }
  }
  pcVar4 = "org.eclipse.cdt.core.MakeErrorParser;";
  if (pcVar2->SupportsGmakeErrorParser != false) {
    pcVar4 = "org.eclipse.cdt.core.GmakeErrorParser;";
  }
  std::operator<<((ostream *)&errorOutputParser,pcVar4);
  std::operator<<((ostream *)&errorOutputParser,
                  "org.eclipse.cdt.core.GCCErrorParser;org.eclipse.cdt.core.GASErrorParser;org.eclipse.cdt.core.GLDErrorParser;"
                 );
  std::__cxx11::stringbuf::str();
  AppendDictionary<std::__cxx11::string>
            (&xml,"org.eclipse.cdt.core.errorOutputParser",&sourceLinkedResourceName);
  std::__cxx11::string::~string((string *)&sourceLinkedResourceName);
  cmXMLWriter::EndElement(&xml);
  cmXMLWriter::EndElement(&xml);
  std::__cxx11::string::string
            ((string *)&sourceLinkedResourceName,"buildCommand",(allocator *)&extraNatures);
  cmXMLWriter::StartElement(&xml,&sourceLinkedResourceName);
  std::__cxx11::string::~string((string *)&sourceLinkedResourceName);
  std::__cxx11::string::string
            ((string *)&sourceLinkedResourceName,"name",(allocator *)&extraNatures);
  cmXMLWriter::Element<char[47]>
            (&xml,&sourceLinkedResourceName,
             (char (*) [47])"org.eclipse.cdt.make.core.ScannerConfigBuilder");
  std::__cxx11::string::~string((string *)&sourceLinkedResourceName);
  std::__cxx11::string::string
            ((string *)&sourceLinkedResourceName,"arguments",(allocator *)&extraNatures);
  cmXMLWriter::StartElement(&xml,&sourceLinkedResourceName);
  std::__cxx11::string::~string((string *)&sourceLinkedResourceName);
  cmXMLWriter::EndElement(&xml);
  cmXMLWriter::EndElement(&xml);
  cmXMLWriter::EndElement(&xml);
  std::__cxx11::string::string
            ((string *)&sourceLinkedResourceName,"natures",(allocator *)&extraNatures);
  cmXMLWriter::StartElement(&xml,&sourceLinkedResourceName);
  std::__cxx11::string::~string((string *)&sourceLinkedResourceName);
  std::__cxx11::string::string
            ((string *)&sourceLinkedResourceName,"nature",(allocator *)&extraNatures);
  cmXMLWriter::Element<char[37]>
            (&xml,&sourceLinkedResourceName,(char (*) [37])"org.eclipse.cdt.make.core.makeNature");
  std::__cxx11::string::~string((string *)&sourceLinkedResourceName);
  std::__cxx11::string::string
            ((string *)&sourceLinkedResourceName,"nature",(allocator *)&extraNatures);
  cmXMLWriter::Element<char[46]>
            (&xml,&sourceLinkedResourceName,
             (char (*) [46])"org.eclipse.cdt.make.core.ScannerConfigNature");
  std::__cxx11::string::~string((string *)&sourceLinkedResourceName);
  for (p_Var5 = (pcVar2->Natures)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &(pcVar2->Natures)._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
    std::__cxx11::string::string
              ((string *)&sourceLinkedResourceName,"nature",(allocator *)&extraNatures);
    cmXMLWriter::Element<std::__cxx11::string>
              (&xml,&sourceLinkedResourceName,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var5 + 1));
    std::__cxx11::string::~string((string *)&sourceLinkedResourceName);
  }
  this_00 = cmMakefile::GetState(local_670);
  std::__cxx11::string::string
            ((string *)&sourceLinkedResourceName,"ECLIPSE_EXTRA_NATURES",(allocator *)&extraNatures)
  ;
  pcVar4 = cmState::GetGlobalProperty(this_00,&sourceLinkedResourceName);
  std::__cxx11::string::~string((string *)&sourceLinkedResourceName);
  if (pcVar4 != (char *)0x0) {
    extraNatures.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    extraNatures.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    extraNatures.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&sourceLinkedResourceName,pcVar4,(allocator *)&local_5f8)
    ;
    cmSystemTools::ExpandListArgument(&sourceLinkedResourceName,&extraNatures,false);
    std::__cxx11::string::~string((string *)&sourceLinkedResourceName);
    for (value = extraNatures.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        value != extraNatures.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish; value = value + 1) {
      std::__cxx11::string::string
                ((string *)&sourceLinkedResourceName,"nature",(allocator *)&local_5f8);
      cmXMLWriter::Element<std::__cxx11::string>(&xml,&sourceLinkedResourceName,value);
      std::__cxx11::string::~string((string *)&sourceLinkedResourceName);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&extraNatures);
  }
  cmXMLWriter::EndElement(&xml);
  pcVar2 = local_5d0;
  psVar1 = local_5d8;
  std::__cxx11::string::string
            ((string *)&sourceLinkedResourceName,"linkedResources",(allocator *)&extraNatures);
  cmXMLWriter::StartElement(&xml,&sourceLinkedResourceName);
  std::__cxx11::string::~string((string *)&sourceLinkedResourceName);
  if (pcVar2->IsOutOfSourceBuild == true) {
    std::__cxx11::string::string
              ((string *)&sourceLinkedResourceName,"[Source directory]",(allocator *)&extraNatures);
    pcVar4 = cmLocalGenerator::GetCurrentSourceDirectory(local_678);
    std::__cxx11::string::string((string *)&local_5f8,pcVar4,(allocator *)&local_430);
    std::__cxx11::string::string((string *)&extraNatures,(string *)&local_5f8);
    std::__cxx11::string::~string((string *)&local_5f8);
    bVar3 = cmsys::SystemTools::IsSubDirectory(psVar1,(string *)&extraNatures);
    if (!bVar3) {
      std::__cxx11::string::string((string *)&local_5f8,(string *)&extraNatures);
      AppendLinkedResource(&xml,&sourceLinkedResourceName,&local_5f8,LinkToFolder);
      std::__cxx11::string::~string((string *)&local_5f8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&pcVar2->SrcLinkedResources,&sourceLinkedResourceName);
    }
    std::__cxx11::string::~string((string *)&extraNatures);
    std::__cxx11::string::~string((string *)&sourceLinkedResourceName);
  }
  if (pcVar2->SupportsVirtualFolders == true) {
    CreateLinksToSubprojects(pcVar2,&xml,psVar1);
    CreateLinksForTargets(pcVar2,&xml);
  }
  cmXMLWriter::EndElement(&xml);
  cmXMLWriter::EndElement(&xml);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&errorOutputParser);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&environment);
  cmXMLWriter::~cmXMLWriter(&xml);
  std::__cxx11::string::~string((string *)&compilerId);
LAB_0039a85e:
  cmGeneratedFileStream::~cmGeneratedFileStream(&fout);
  std::__cxx11::string::~string((string *)&filename);
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::CreateProjectFile()
{
  cmLocalGenerator* lg = this->GlobalGenerator->GetLocalGenerators()[0];
  cmMakefile* mf = lg->GetMakefile();

  const std::string filename = this->HomeOutputDirectory + "/.project";

  cmGeneratedFileStream fout(filename.c_str());
  if (!fout) {
    return;
  }

  std::string compilerId = mf->GetSafeDefinition("CMAKE_C_COMPILER_ID");
  if (compilerId.empty()) // no C compiler, try the C++ compiler:
  {
    compilerId = mf->GetSafeDefinition("CMAKE_CXX_COMPILER_ID");
  }

  cmXMLWriter xml(fout);

  xml.StartDocument("UTF-8");
  xml.StartElement("projectDescription");

  xml.Element("name", this->GenerateProjectName(
                        lg->GetProjectName(),
                        mf->GetSafeDefinition("CMAKE_BUILD_TYPE"),
                        this->GetPathBasename(this->HomeOutputDirectory)));

  xml.Element("comment", "");
  xml.Element("projects", "");

  xml.StartElement("buildSpec");
  xml.StartElement("buildCommand");
  xml.Element("name", "org.eclipse.cdt.make.core.makeBuilder");
  xml.Element("triggers", "clean,full,incremental,");
  xml.StartElement("arguments");

  // use clean target
  AppendDictionary(xml, "org.eclipse.cdt.make.core.cleanBuildTarget", "clean");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.enableCleanBuild", "true");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.append_environment",
                   "true");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.stopOnError", "true");

  // set the make command
  AppendDictionary(xml, "org.eclipse.cdt.make.core.enabledIncrementalBuild",
                   "true");
  AppendDictionary(
    xml, "org.eclipse.cdt.make.core.build.command",
    this->GetEclipsePath(mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM")));
  AppendDictionary(xml, "org.eclipse.cdt.make.core.contents",
                   "org.eclipse.cdt.make.core.activeConfigSettings");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.build.target.inc", "all");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.build.arguments",
                   mf->GetSafeDefinition("CMAKE_ECLIPSE_MAKE_ARGUMENTS"));
  AppendDictionary(xml, "org.eclipse.cdt.make.core.buildLocation",
                   this->GetEclipsePath(this->HomeOutputDirectory));
  AppendDictionary(xml, "org.eclipse.cdt.make.core.useDefaultBuildCmd",
                   "false");

  // set project specific environment
  std::ostringstream environment;
  environment << "VERBOSE=1|CMAKE_NO_VERBOSE=1|"; // verbose Makefile output
  // set vsvars32.bat environment available at CMake time,
  //   but not necessarily when eclipse is open
  if (compilerId == "MSVC") {
    AddEnvVar(environment, "PATH", lg);
    AddEnvVar(environment, "INCLUDE", lg);
    AddEnvVar(environment, "LIB", lg);
    AddEnvVar(environment, "LIBPATH", lg);
  } else if (compilerId == "Intel") {
    // if the env.var is set, use this one and put it in the cache
    // if the env.var is not set, but the value is in the cache,
    // use it from the cache:
    AddEnvVar(environment, "INTEL_LICENSE_FILE", lg);
  }
  AppendDictionary(xml, "org.eclipse.cdt.make.core.environment",
                   environment.str());

  AppendDictionary(xml, "org.eclipse.cdt.make.core.enableFullBuild", "true");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.build.target.auto", "all");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.enableAutoBuild", "false");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.build.target.clean",
                   "clean");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.fullBuildTarget", "all");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.buildArguments", "");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.build.location",
                   this->GetEclipsePath(this->HomeOutputDirectory));
  AppendDictionary(xml, "org.eclipse.cdt.make.core.autoBuildTarget", "all");

  // set error parsers
  std::ostringstream errorOutputParser;

  if (compilerId == "MSVC") {
    errorOutputParser << "org.eclipse.cdt.core.VCErrorParser;";
  } else if (compilerId == "Intel") {
    errorOutputParser << "org.eclipse.cdt.core.ICCErrorParser;";
  }

  if (this->SupportsGmakeErrorParser) {
    errorOutputParser << "org.eclipse.cdt.core.GmakeErrorParser;";
  } else {
    errorOutputParser << "org.eclipse.cdt.core.MakeErrorParser;";
  }

  errorOutputParser << "org.eclipse.cdt.core.GCCErrorParser;"
                       "org.eclipse.cdt.core.GASErrorParser;"
                       "org.eclipse.cdt.core.GLDErrorParser;";
  AppendDictionary(xml, "org.eclipse.cdt.core.errorOutputParser",
                   errorOutputParser.str());

  xml.EndElement(); // arguments
  xml.EndElement(); // buildCommand
  xml.StartElement("buildCommand");
  xml.Element("name", "org.eclipse.cdt.make.core.ScannerConfigBuilder");
  xml.StartElement("arguments");
  xml.EndElement(); // arguments
  xml.EndElement(); // buildCommand
  xml.EndElement(); // buildSpec

  // set natures for c/c++ projects
  xml.StartElement("natures");
  xml.Element("nature", "org.eclipse.cdt.make.core.makeNature");
  xml.Element("nature", "org.eclipse.cdt.make.core.ScannerConfigNature");
  ;

  for (std::set<std::string>::const_iterator nit = this->Natures.begin();
       nit != this->Natures.end(); ++nit) {
    xml.Element("nature", *nit);
  }

  if (const char* extraNaturesProp =
        mf->GetState()->GetGlobalProperty("ECLIPSE_EXTRA_NATURES")) {
    std::vector<std::string> extraNatures;
    cmSystemTools::ExpandListArgument(extraNaturesProp, extraNatures);
    for (std::vector<std::string>::const_iterator nit = extraNatures.begin();
         nit != extraNatures.end(); ++nit) {
      xml.Element("nature", *nit);
    }
  }

  xml.EndElement(); // natures

  xml.StartElement("linkedResources");
  // create linked resources
  if (this->IsOutOfSourceBuild) {
    // create a linked resource to CMAKE_SOURCE_DIR
    // (this is not done anymore for each project because of
    // https://gitlab.kitware.com/cmake/cmake/issues/9978 and because I found
    // it actually quite confusing in bigger projects with many directories and
    // projects, Alex

    std::string sourceLinkedResourceName = "[Source directory]";
    std::string linkSourceDirectory =
      this->GetEclipsePath(lg->GetCurrentSourceDirectory());
    // .project dir can't be subdir of a linked resource dir
    if (!cmSystemTools::IsSubDirectory(this->HomeOutputDirectory,
                                       linkSourceDirectory)) {
      this->AppendLinkedResource(xml, sourceLinkedResourceName,
                                 this->GetEclipsePath(linkSourceDirectory),
                                 LinkToFolder);
      this->SrcLinkedResources.push_back(sourceLinkedResourceName);
    }
  }

  if (this->SupportsVirtualFolders) {
    this->CreateLinksToSubprojects(xml, this->HomeOutputDirectory);

    this->CreateLinksForTargets(xml);
  }

  xml.EndElement(); // linkedResources
  xml.EndElement(); // projectDescription
}